

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-pta-dump.cpp
# Opt level: O3

void dumpPointerGraphData(PSNode *n,PTType type,bool dot)

{
  MemoryObject *mo;
  long *plVar1;
  _Base_ptr p_Var2;
  const_iterator __end1;
  char *pcVar3;
  
  mo = *(MemoryObject **)(n + 0x10);
  if (type == fi) {
    if (mo == (MemoryObject *)0x0) {
      return;
    }
    if (dot) {
      printf("\\n    Memory: ---\\n");
      dumpMemoryObject(mo,6,true);
      return;
    }
    puts("    Memory: ---");
    dumpMemoryObject(mo,6,false);
    pcVar3 = "    -----------";
    goto LAB_001134b1;
  }
  if (mo == (MemoryObject *)0x0) {
    return;
  }
  pcVar3 = "    Memory map: [%p]\n";
  if (dot) {
    pcVar3 = "\\n------\\n    --- Memory map [%p] ---\\n";
  }
  printf(pcVar3,mo);
  if (verbose_more[0x80] == '\0') {
    plVar1 = *(long **)(n + 0x40);
    if (*(long **)(n + 0x48) == plVar1) goto LAB_001133b8;
    do {
      if (*(long *)(*plVar1 + 0x10) != *(long *)(n + 0x10)) goto LAB_001133b8;
      plVar1 = plVar1 + 1;
    } while (plVar1 != *(long **)(n + 0x48));
  }
  else {
LAB_001133b8:
    for (p_Var2 = (mo->pointsTo)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var2 != (_Base_ptr)&mo->pointsTo; p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      if (dot) {
        putchar(0x3c);
        printName(*(PSNode **)(p_Var2 + 1),true);
        putchar(0x3e);
        printf("\\l");
      }
      else {
        printf("%*s",6,"");
        putchar(0x3c);
        printName(*(PSNode **)(p_Var2 + 1),false);
        putchar(0x3e);
        putchar(10);
      }
      dumpMemoryObject((MemoryObject *)p_Var2[1]._M_parent,10,dot);
    }
  }
  if (dot) {
    return;
  }
  pcVar3 = "    ----------------";
LAB_001134b1:
  puts(pcVar3);
  return;
}

Assistant:

static void dumpPointerGraphData(PSNode *n, PTType type, bool dot = false) {
    assert(n && "No node given");
    if (type == dg::LLVMPointerAnalysisOptions::AnalysisType::fi) {
        MemoryObject *mo = n->getData<MemoryObject>();
        if (!mo)
            return;

        if (dot)
            printf("\\n    Memory: ---\\n");
        else
            printf("    Memory: ---\n");

        dumpMemoryObject(mo, 6, dot);

        if (!dot)
            printf("    -----------\n");
    } else {
        PointerAnalysisFS::MemoryMapT *mm =
                n->getData<PointerAnalysisFS::MemoryMapT>();
        if (!mm)
            return;

        if (dot)
            printf(R"(\n------\n    --- Memory map [%p] ---\n)",
                   static_cast<void *>(mm));
        else
            printf("    Memory map: [%p]\n", static_cast<void *>(mm));

        if (verbose_more || mmChanged(n))
            dumpMemoryMap(mm, 6, dot);

        if (!dot)
            printf("    ----------------\n");
    }
}